

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigWin.c
# Opt level: O1

void Aig_ManFindCut(Aig_Obj_t *pRoot,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited,int nSizeLimit,
                   int nFanoutLimit)

{
  byte *pbVar1;
  ulong *puVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  void **ppvVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  
  if (((ulong)pRoot & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                  ,0x96,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  if ((*(uint *)&pRoot->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pRoot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                  ,0x97,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  pAVar4 = pRoot->pFanin0;
  if (pAVar4 == (Aig_Obj_t *)0x0) {
    __assert_fail("Aig_ObjChild0(pRoot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                  ,0x98,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  if (pRoot->pFanin1 == (Aig_Obj_t *)0x0) {
    __assert_fail("Aig_ObjChild1(pRoot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                  ,0x99,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  vFront->nSize = 0;
  if (vFront->nCap == 0) {
    if (vFront->pArray == (void **)0x0) {
      ppvVar6 = (void **)malloc(0x80);
    }
    else {
      ppvVar6 = (void **)realloc(vFront->pArray,0x80);
    }
    vFront->pArray = ppvVar6;
    vFront->nCap = 0x10;
  }
  iVar5 = vFront->nSize;
  uVar9 = iVar5 + 1;
  vFront->nSize = uVar9;
  vFront->pArray[iVar5] = (void *)((ulong)pAVar4 & 0xfffffffffffffffe);
  pAVar4 = pRoot->pFanin1;
  uVar3 = vFront->nCap;
  if (uVar9 == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vFront->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vFront->pArray,0x80);
      }
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar3 * 2;
      if (iVar5 <= (int)uVar3) goto LAB_0064782d;
      if (vFront->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vFront->pArray,(ulong)uVar3 << 4);
      }
    }
    vFront->pArray = ppvVar6;
    vFront->nCap = iVar5;
  }
LAB_0064782d:
  iVar5 = vFront->nSize;
  vFront->nSize = iVar5 + 1;
  vFront->pArray[iVar5] = (void *)((ulong)pAVar4 & 0xfffffffffffffffe);
  vVisited->nSize = 0;
  if (vVisited->nCap == 0) {
    if (vVisited->pArray == (void **)0x0) {
      ppvVar6 = (void **)malloc(0x80);
    }
    else {
      ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
    }
    vVisited->pArray = ppvVar6;
    vVisited->nCap = 0x10;
  }
  iVar5 = vVisited->nSize;
  uVar9 = iVar5 + 1;
  vVisited->nSize = uVar9;
  vVisited->pArray[iVar5] = pRoot;
  pAVar4 = pRoot->pFanin0;
  uVar3 = vVisited->nCap;
  if (uVar9 == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
      }
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar3 * 2;
      if (iVar5 <= (int)uVar3) goto LAB_006478f7;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar3 << 4);
      }
    }
    vVisited->pArray = ppvVar6;
    vVisited->nCap = iVar5;
  }
LAB_006478f7:
  iVar5 = vVisited->nSize;
  uVar9 = iVar5 + 1;
  vVisited->nSize = uVar9;
  vVisited->pArray[iVar5] = (void *)((ulong)pAVar4 & 0xfffffffffffffffe);
  pAVar4 = pRoot->pFanin1;
  uVar3 = vVisited->nCap;
  if (uVar9 == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
      }
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar3 * 2;
      if (iVar5 <= (int)uVar3) goto LAB_00647975;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar3 << 4);
      }
    }
    vVisited->pArray = ppvVar6;
    vVisited->nCap = iVar5;
  }
LAB_00647975:
  iVar5 = vVisited->nSize;
  vVisited->nSize = iVar5 + 1;
  vVisited->pArray[iVar5] = (void *)((ulong)pAVar4 & 0xfffffffffffffffe);
  if ((*(ulong *)&pRoot->field_0x18 & 0x10) != 0) {
    __assert_fail("!pRoot->fMarkA",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                  ,0xa7,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  uVar8 = (ulong)pRoot->pFanin0 & 0xfffffffffffffffe;
  if ((*(byte *)(uVar8 + 0x18) & 0x10) != 0) {
    __assert_fail("!Aig_ObjFanin0(pRoot)->fMarkA",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                  ,0xa8,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  if ((*(byte *)(((ulong)pRoot->pFanin1 & 0xfffffffffffffffe) + 0x18) & 0x10) != 0) {
    __assert_fail("!Aig_ObjFanin1(pRoot)->fMarkA",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                  ,0xa9,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  *(ulong *)&pRoot->field_0x18 = *(ulong *)&pRoot->field_0x18 | 0x10;
  pbVar1 = (byte *)(uVar8 + 0x18);
  *pbVar1 = *pbVar1 | 0x10;
  puVar2 = (ulong *)(((ulong)pRoot->pFanin1 & 0xfffffffffffffffe) + 0x18);
  *puVar2 = *puVar2 | 0x10;
  do {
    iVar5 = Aig_ManFindCut_int(vFront,vVisited,nSizeLimit,nFanoutLimit);
  } while (iVar5 != 0);
  if (vFront->nSize <= nSizeLimit) {
    if (0 < vVisited->nSize) {
      lVar7 = 0;
      do {
        puVar2 = (ulong *)((long)vVisited->pArray[lVar7] + 0x18);
        *puVar2 = *puVar2 & 0xffffffffffffffef;
        lVar7 = lVar7 + 1;
      } while (lVar7 < vVisited->nSize);
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vFront) <= nSizeLimit",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                ,0xb0,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
}

Assistant:

void Aig_ManFindCut( Aig_Obj_t * pRoot, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited, int nSizeLimit, int nFanoutLimit )
{
    Aig_Obj_t * pNode;
    int i;

    assert( !Aig_IsComplement(pRoot) );
    assert( Aig_ObjIsNode(pRoot) );
    assert( Aig_ObjChild0(pRoot) );
    assert( Aig_ObjChild1(pRoot) );

    // start the cut 
    Vec_PtrClear( vFront );
    Vec_PtrPush( vFront, Aig_ObjFanin0(pRoot) );
    Vec_PtrPush( vFront, Aig_ObjFanin1(pRoot) );

    // start the visited nodes
    Vec_PtrClear( vVisited );
    Vec_PtrPush( vVisited, pRoot );
    Vec_PtrPush( vVisited, Aig_ObjFanin0(pRoot) );
    Vec_PtrPush( vVisited, Aig_ObjFanin1(pRoot) );

    // mark these nodes
    assert( !pRoot->fMarkA );
    assert( !Aig_ObjFanin0(pRoot)->fMarkA );
    assert( !Aig_ObjFanin1(pRoot)->fMarkA );
    pRoot->fMarkA = 1;
    Aig_ObjFanin0(pRoot)->fMarkA = 1;
    Aig_ObjFanin1(pRoot)->fMarkA = 1;

    // compute the cut
    while ( Aig_ManFindCut_int( vFront, vVisited, nSizeLimit, nFanoutLimit ) );
    assert( Vec_PtrSize(vFront) <= nSizeLimit );

    // clean the visit markings
    Vec_PtrForEachEntry( Aig_Obj_t *, vVisited, pNode, i )
        pNode->fMarkA = 0;
}